

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_extensions.cpp
# Opt level: O1

directory * dlib::get_parent_directory(directory *__return_storage_ptr__,file *f)

{
  long lVar1;
  string *psVar2;
  string local_38;
  
  if ((f->state).full_name._M_string_length != 0) {
    psVar2 = &(f->state).full_name;
    lVar1 = std::__cxx11::string::find_last_of((char *)psVar2,0x2c0360,0xffffffffffffffff);
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)&local_38,(ulong)psVar2);
      directory::directory(__return_storage_ptr__,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_38._M_dataplus._M_p);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->state).name._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->state).name.field_2;
  (__return_storage_ptr__->state).name._M_string_length = 0;
  (__return_storage_ptr__->state).name.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->state).full_name._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->state).full_name.field_2;
  (__return_storage_ptr__->state).full_name._M_string_length = 0;
  (__return_storage_ptr__->state).full_name.field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

directory get_parent_directory (
        const file& f
    )
    {
        if (f.full_name().size() == 0)
            return directory();

        std::string::size_type pos = f.full_name().find_last_of("\\/");
        
        if (pos == std::string::npos)
            return directory();

        return directory(f.full_name().substr(0,pos));
    }